

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrameTranslator.cpp
# Opt level: O2

Expression * __thiscall IRT::FrameTranslator::GetField(FrameTranslator *this,string *name)

{
  __type _Var1;
  int iVar2;
  int iVar3;
  mapped_type *pmVar4;
  undefined4 extraout_var;
  ClassStorage *pCVar5;
  mapped_type *pmVar6;
  MemExpression *this_00;
  BinopExpression *this_01;
  ConstExpression *this_02;
  runtime_error *this_03;
  _Elt_pointer ppAVar7;
  pointer this_04;
  int value;
  _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_e0;
  vector<Symbol,_std::allocator<Symbol>_> field_names;
  allocator<char> local_90 [32];
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"this",local_90);
  pmVar4 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->addresses_,(key_type *)&local_e0);
  ppAVar7 = (pmVar4->c).super__Deque_base<IRT::Address_*,_std::allocator<IRT::Address_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar7 ==
      (pmVar4->c).super__Deque_base<IRT::Address_*,_std::allocator<IRT::Address_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppAVar7 = (pmVar4->c).super__Deque_base<IRT::Address_*,_std::allocator<IRT::Address_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  iVar2 = (*ppAVar7[-1]->_vptr_Address[2])();
  std::__cxx11::string::~string((string *)&local_e0);
  pCVar5 = ClassStorage::GetInstance();
  std::__cxx11::string::string((string *)&local_70,(string *)&this->class_name_);
  Symbol::Symbol((Symbol *)&local_e0,&local_70);
  ClassStorage::GetFieldsNames(&field_names,pCVar5,(Symbol *)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_70);
  value = 0;
  this_04 = field_names.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (this_04 ==
        field_names.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0,
                     "Undeclared field: ",name);
      std::runtime_error::runtime_error(this_03,(string *)&local_e0);
      __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Symbol::GetName_abi_cxx11_((string *)&local_e0,this_04);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_e0,name);
    std::__cxx11::string::~string((string *)&local_e0);
    if (_Var1) break;
    pCVar5 = ClassStorage::GetInstance();
    std::__cxx11::string::string((string *)&local_50,(string *)&this->class_name_);
    Symbol::Symbol((Symbol *)local_90,&local_50);
    ClassStorage::GetFields
              ((unordered_map<Symbol,_std::shared_ptr<PrimitiveObject>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>_>
                *)&local_e0,pCVar5,(Symbol *)local_90);
    pmVar6 = std::__detail::
             _Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&local_e0,this_04);
    iVar3 = (*(((pmVar6->super___shared_ptr<PrimitiveObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_Object)._vptr_Object[3])();
    value = value + iVar3;
    std::
    _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_e0);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)&local_50);
    this_04 = this_04 + 1;
  }
  this_00 = (MemExpression *)operator_new(0x10);
  this_01 = (BinopExpression *)operator_new(0x20);
  this_02 = (ConstExpression *)operator_new(0x10);
  ConstExpression::ConstExpression(this_02,value);
  BinopExpression::BinopExpression
            (this_01,PLUS,(Expression *)CONCAT44(extraout_var,iVar2),(Expression *)this_02);
  MemExpression::MemExpression(this_00,(Expression *)this_01);
  std::vector<Symbol,_std::allocator<Symbol>_>::~vector(&field_names);
  return &this_00->super_Expression;
}

Assistant:

IRT::Expression* FrameTranslator::GetField(const std::string& name) {
  IRT::Expression* this_ptr = addresses_["this"].top()->ToExpression();
  IRT::Expression* field_ptr;

  auto field_names =
      ClassStorage::GetInstance().GetFieldsNames(Symbol(class_name_));
  bool is_found = false;
  size_t offset = 0;

  for (auto&& field : field_names) {
    if (field.GetName() == name) {
      is_found = true;
      break;
    }
    offset += ClassStorage::GetInstance()
                  .GetFields(Symbol(class_name_))[field]
                  ->GetSize();
  }
  if (is_found) {
    field_ptr = new MemExpression(new BinopExpression(
        BinaryOperatorType::PLUS, this_ptr, new ConstExpression(offset)));
  } else {
    throw std::runtime_error("Undeclared field: " + name);
  }

  return field_ptr;
}